

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::readOp<(moira::Core)0,(moira::Mode)7,2,0ull>(Moira *this,int n,u32 *ea,u32 *result)

{
  u32 uVar1;
  u32 *result_local;
  u32 *ea_local;
  int n_local;
  Moira *this_local;
  
  uVar1 = computeEA<(moira::Core)0,(moira::Mode)7,2,0ull>(this,n);
  *ea = uVar1;
  updateAnPD<(moira::Mode)7,2>(this,n);
  uVar1 = readM<(moira::Core)0,(moira::Mode)7,2,0ull>(this,*ea);
  *result = uVar1;
  updateAnPI<(moira::Mode)7,2>(this,n);
  return;
}

Assistant:

void
Moira::readOp(int n, u32 *ea, u32 *result)
{
    switch (M) {

        case Mode::DN: *result = readD<S>(n);   break;
        case Mode::AN: *result = readA<S>(n);   break;
        case Mode::IM: *result = readI<C, S>(); break;

        default:

            // Compute effective address
            *ea = computeEA<C, M, S, F>(n);

            // Emulate -(An) register modification
            updateAnPD<M, S>(n);

            // Read from effective address
            *result = readM<C, M, S, F>(*ea);

            // Emulate (An)+ register modification
            updateAnPI<M, S>(n);
    }
}